

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O3

Bool prvTidynodeIsAutonomousCustomTag(TidyDocImpl *doc,Node *node)

{
  char *__s;
  char *pcVar1;
  Bool BVar2;
  
  __s = node->element;
  BVar2 = no;
  if (__s != (char *)0x0) {
    pcVar1 = strchr(__s,0x2d);
    if ((pcVar1 != __s && -1 < (long)pcVar1 - (long)__s) && pcVar1 != (char *)0x0) {
      BVar2 = (Bool)((doc->config).value[0x56].v != 0);
    }
  }
  return BVar2;
}

Assistant:

Bool TY_(nodeIsAutonomousCustomFormat)( Node* node )
{
    if ( node->element )
        return TY_(elementIsAutonomousCustomFormat)( node->element );

    return no;
}